

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int16 *
ma_dr_wav_open_file_and_read_pcm_frames_s16
          (char *filename,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalFrameCountOut,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  ma_dr_wav wav;
  char *in_stack_fffffffffffffe38;
  ma_dr_wav *in_stack_fffffffffffffe40;
  ma_uint64 *in_stack_fffffffffffffe50;
  uint *in_stack_fffffffffffffe58;
  uint *in_stack_fffffffffffffe60;
  ma_dr_wav *in_stack_fffffffffffffe68;
  undefined8 local_8;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = 0;
  }
  mVar1 = ma_dr_wav_init_file(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                              (ma_allocation_callbacks *)0x2529c5);
  if (mVar1 == 0) {
    local_8 = (ma_int16 *)0x0;
  }
  else {
    local_8 = ma_dr_wav__read_pcm_frames_and_close_s16
                        (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  }
  return local_8;
}

Assistant:

MA_API ma_int16* ma_dr_wav_open_file_and_read_pcm_frames_s16(const char* filename, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_wav wav;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }
    if (!ma_dr_wav_init_file(&wav, filename, pAllocationCallbacks)) {
        return NULL;
    }
    return ma_dr_wav__read_pcm_frames_and_close_s16(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}